

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O0

size_t Assimp::OpenGEX::countDataArrayListItems(DataArrayList *vaList)

{
  DataArrayList *local_28;
  DataArrayList *next;
  size_t numItems;
  DataArrayList *vaList_local;
  
  next = (DataArrayList *)0x0;
  local_28 = vaList;
  if (vaList == (DataArrayList *)0x0) {
    vaList_local = (DataArrayList *)0x0;
  }
  else {
    for (; local_28 != (DataArrayList *)0x0; local_28 = local_28->m_next) {
      if (vaList->m_dataList != (Value *)0x0) {
        next = (DataArrayList *)((long)&next->m_numItems + 1);
      }
    }
    vaList_local = next;
  }
  return (size_t)vaList_local;
}

Assistant:

static size_t countDataArrayListItems( DataArrayList *vaList ) {
    size_t numItems( 0 );
    if( nullptr == vaList ) {
        return numItems;
    }

    DataArrayList *next( vaList );
    while( nullptr != next ) {
        if( nullptr != vaList->m_dataList ) {
            numItems++;
        }
        next = next->m_next;
    }

    return numItems;
}